

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O2

void base64_stream_encode_ssse3
               (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  byte bVar5;
  uint8_t *local_58;
  byte *local_50;
  size_t local_48;
  base64_state *local_40;
  size_t *local_38;
  
  uVar3 = state->bytes;
  local_48 = (size_t)uVar3;
  sVar4 = 0;
  bVar5 = state->carry;
  local_40 = state;
  local_38 = outlen;
  if (local_48 == 2) goto LAB_00103057;
  if (uVar3 == 1) goto LAB_0010301e;
  local_58 = (uint8_t *)out;
  local_50 = (byte *)src;
  if (uVar3 == 0) {
    do {
      if (0xf < srclen) {
        uVar1 = (srclen - 4) / 0xc;
        srclen = srclen + uVar1 * -0xc;
        local_48 = uVar1 * 0x10 + local_48;
        do {
          if (uVar1 < 8) {
            lVar2 = -4;
            if (3 < uVar1) goto LAB_00102f93;
            enc_loop_ssse3_inner(&local_50,&local_58);
            lVar2 = -2;
            if (uVar1 < 2) break;
          }
          else {
            enc_loop_ssse3_inner(&local_50,&local_58);
            enc_loop_ssse3_inner(&local_50,&local_58);
            enc_loop_ssse3_inner(&local_50,&local_58);
            enc_loop_ssse3_inner(&local_50,&local_58);
            lVar2 = -8;
LAB_00102f93:
            enc_loop_ssse3_inner(&local_50,&local_58);
            enc_loop_ssse3_inner(&local_50,&local_58);
            enc_loop_ssse3_inner(&local_50,&local_58);
          }
          enc_loop_ssse3_inner(&local_50,&local_58);
          uVar1 = uVar1 + lVar2;
        } while (uVar1 != 0);
      }
      if (srclen == 0) {
        uVar3 = 0;
        sVar4 = local_48;
        break;
      }
      srclen = srclen - 1;
      *local_58 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[*local_50 >> 2]
      ;
      out = (char *)(local_58 + 1);
      src = (char *)(local_50 + 1);
      bVar5 = (*local_50 & 3) << 4;
      sVar4 = local_48 + 1;
LAB_0010301e:
      if (srclen == 0) {
        uVar3 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar5 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar5 = *src;
      src = (char *)((byte *)src + 1);
      bVar5 = (bVar5 & 0xf) << 2;
      sVar4 = sVar4 + 1;
LAB_00103057:
      if (srclen == 0) goto LAB_001030a1;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar5 | (byte)*src >> 6)];
      local_50 = (byte *)src + 1;
      local_58 = (uint8_t *)out + 2;
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)*src & 0x3f];
      local_48 = sVar4 + 2;
    } while( true );
  }
LAB_001030ae:
  local_40->bytes = uVar3;
  local_40->carry = bVar5;
  *local_38 = sVar4;
  return;
LAB_001030a1:
  uVar3 = 2;
  goto LAB_001030ae;
}

Assistant:

BASE64_ENC_FUNCTION(ssse3)
{
#if HAVE_SSSE3
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}